

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsPrimaryTypes.cpp
# Opt level: O1

void helics::valueExtract(defV *data,vector<double,_std::allocator<double>_> *val)

{
  pointer pdVar1;
  pointer pcVar2;
  variant_alternative_t<0UL,_variant<double,_long,_basic_string<char,_char_traits<char>,_allocator<char>_>,_complex<double>,_vector<double,_allocator<double>_>,_vector<complex<double>,_allocator<complex<double>_>_>,_NamedPoint>_>
  *__args;
  variant_alternative_t<3UL,_variant<double,_long,_basic_string<char,_char_traits<char>,_allocator<char>_>,_complex<double>,_vector<double,_allocator<double>_>,_vector<complex<double>,_allocator<complex<double>_>_>,_NamedPoint>_>
  *pvVar3;
  variant_alternative_t<6UL,_variant<double,_long,_basic_string<char,_char_traits<char>,_allocator<char>_>,_complex<double>,_vector<double,_allocator<double>_>,_vector<complex<double>,_allocator<complex<double>_>_>,_NamedPoint>_>
  *pvVar4;
  variant_alternative_t<2UL,_variant<double,_long,_basic_string<char,_char_traits<char>,_allocator<char>_>,_complex<double>,_vector<double,_allocator<double>_>,_vector<complex<double>,_allocator<complex<double>_>_>,_NamedPoint>_>
  *pvVar5;
  variant_alternative_t<1UL,_variant<double,_long,_basic_string<char,_char_traits<char>,_allocator<char>_>,_complex<double>,_vector<double,_allocator<double>_>,_vector<complex<double>,_allocator<complex<double>_>_>,_NamedPoint>_>
  *pvVar6;
  variant_alternative_t<4UL,_variant<double,_long,_basic_string<char,_char_traits<char>,_allocator<char>_>,_complex<double>,_vector<double,_allocator<double>_>,_vector<complex<double>,_allocator<complex<double>_>_>,_NamedPoint>_>
  *__x;
  variant_alternative_t<5UL,_variant<double,_long,_basic_string<char,_char_traits<char>,_allocator<char>_>,_complex<double>,_vector<double,_allocator<double>_>,_vector<complex<double>,_allocator<complex<double>_>_>,_NamedPoint>_>
  *pvVar7;
  uint *puVar8;
  iterator iVar9;
  complex<double> *cval;
  pointer pcVar10;
  string_view val_00;
  string_view val_01;
  vector<double,_std::allocator<double>_> local_40;
  pointer local_28;
  
  std::vector<double,_std::allocator<double>_>::resize(val,0);
  puVar8 = &switchD_0020360d::switchdataD_003dc550;
  switch((data->
         super__Variant_base<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
         ).
         super__Move_assign_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
         .
         super__Copy_assign_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
         .
         super__Move_ctor_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
         .
         super__Copy_ctor_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
         .
         super__Variant_storage_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
         ._M_index) {
  case '\0':
    __args = std::
             get<0ul,double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
                       (data);
    iVar9._M_current =
         (val->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
         _M_finish;
    if (iVar9._M_current ==
        (val->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
        _M_end_of_storage) {
      std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                ((vector<double,std::allocator<double>> *)val,iVar9,__args);
      return;
    }
    local_40.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)*__args;
    break;
  case '\x01':
    pvVar6 = std::
             get<1ul,double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
                       (data);
    local_40.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)(double)*pvVar6;
    iVar9._M_current =
         (val->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
         _M_finish;
    if (iVar9._M_current ==
        (val->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
        _M_end_of_storage) {
LAB_002037e1:
      std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                (val,iVar9,(double *)&local_40);
      return;
    }
    break;
  default:
    pvVar5 = std::
             get<2ul,double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
                       (data);
    val_01._M_str = (pvVar5->_M_dataplus)._M_p;
    val_01._M_len = pvVar5->_M_string_length;
    helicsGetVector(val_01,val);
    return;
  case '\x03':
    pvVar3 = std::
             get<3ul,double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
                       (data);
    local_40.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = *(pointer *)pvVar3->_M_value;
    pdVar1 = *(pointer *)(pvVar3->_M_value + 8);
    iVar9._M_current =
         (val->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
         _M_finish;
    if (iVar9._M_current ==
        (val->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
        _M_end_of_storage) {
      local_28 = pdVar1;
      std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                (val,iVar9,(double *)&local_40);
      local_40.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start = local_28;
    }
    else {
      *iVar9._M_current =
           (double)local_40.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
      (val->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
      _M_finish = iVar9._M_current + 1;
      local_40.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start = pdVar1;
    }
    if (((double)local_40.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start == 0.0) &&
       (!NAN((double)local_40.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start))) {
      return;
    }
    iVar9._M_current =
         (val->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
         _M_finish;
    if (iVar9._M_current ==
        (val->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
        _M_end_of_storage) goto LAB_002037e1;
    *iVar9._M_current =
         (double)local_40.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
    goto LAB_002037d7;
  case '\x04':
    __x = std::
          get<4ul,double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
                    (data);
    std::vector<double,_std::allocator<double>_>::operator=(val,__x);
    return;
  case '\x05':
    pvVar7 = std::
             get<5ul,double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
                       (data);
    std::vector<double,_std::allocator<double>_>::reserve
              (val,(long)(pvVar7->
                         super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                         )._M_impl.super__Vector_impl_data._M_finish -
                   (long)(pvVar7->
                         super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                         )._M_impl.super__Vector_impl_data._M_start >> 4);
    pdVar1 = (val->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if ((val->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
        _M_finish != pdVar1) {
      (val->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
      _M_finish = pdVar1;
    }
    pcVar10 = (pvVar7->
              super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>).
              _M_impl.super__Vector_impl_data._M_start;
    pcVar2 = (pvVar7->
             super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>).
             _M_impl.super__Vector_impl_data._M_finish;
    if (pcVar10 == pcVar2) {
      return;
    }
    do {
      if ((*(double *)(pcVar10->_M_value + 8) != 0.0) || (NAN(*(double *)(pcVar10->_M_value + 8))))
      {
        local_40.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start = (pointer)cabs(*(double *)pcVar10->_M_value);
      }
      else {
        local_40.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start = *(pointer *)pcVar10->_M_value;
      }
      iVar9._M_current =
           (val->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar9._M_current ==
          (val->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data
          ._M_end_of_storage) {
        std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                  (val,iVar9,(double *)&local_40);
      }
      else {
        *iVar9._M_current =
             (double)local_40.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start;
        (val->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
        _M_finish = iVar9._M_current + 1;
      }
      pcVar10 = pcVar10 + 1;
    } while (pcVar10 != pcVar2);
    return;
  case '\x06':
    pvVar4 = std::
             get<6ul,double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
                       (data);
    if (!NAN(pvVar4->value)) {
      std::vector<double,_std::allocator<double>_>::resize(val,1);
      *(val->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
       _M_start = pvVar4->value;
      return;
    }
    val_00._M_str = (char *)puVar8;
    val_00._M_len = (size_t)(pvVar4->name)._M_dataplus._M_p;
    helicsGetVector(&local_40,(helics *)(pvVar4->name)._M_string_length,val_00);
    std::vector<double,_std::allocator<double>_>::_M_move_assign(val,&local_40);
    if (local_40.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start == (pointer)0x0) {
      return;
    }
    operator_delete(local_40.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_40.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_40.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
    return;
  }
  *iVar9._M_current =
       (double)local_40.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
LAB_002037d7:
  (val->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
  _M_finish = iVar9._M_current + 1;
  return;
}

Assistant:

void valueExtract(const defV& data, std::vector<double>& val)
{
    val.resize(0);
    switch (data.index()) {
        case double_loc:  // double
            val.push_back(std::get<double>(data));
            break;
        case int_loc:  // int64_t
            val.push_back(static_cast<double>(std::get<int64_t>(data)));
            break;
        case string_loc:  // string
        default:
            helicsGetVector(std::get<std::string>(data), val);
            break;
        case complex_loc:  // complex
        {
            const std::complex<double> cval = std::get<std::complex<double>>(data);
            val.push_back(cval.real());
            if (cval.imag() != 0.0) {
                val.push_back(cval.imag());
            }
        } break;
        case vector_loc:  // vector
            val = std::get<std::vector<double>>(data);
            break;
        case complex_vector_loc:  // complex
        {
            const auto& cvec = std::get<std::vector<std::complex<double>>>(data);
            val.reserve(cvec.size());
            val.clear();
            for (const auto& cval : cvec) {
                if (cval.imag() == 0.0) {
                    val.push_back(cval.real());
                } else {
                    val.push_back(std::abs(cval));
                }
            }
        } break;
        case named_point_loc:  // named point
        {
            const auto& point = std::get<NamedPoint>(data);
            if (std::isnan(point.value)) {
                val = helicsGetVector(point.name);
            } else {
                val.resize(1);
                val[0] = point.value;
            }
            break;
        }
    }
}